

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_MergeSortCostMerge(int *p1Beg,int *p1End,int *p2Beg,int *p2End,int *pOut)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  
  uVar4 = (long)p1End - (long)p1Beg;
  uVar2 = (long)p2End - (long)p2Beg;
  piVar6 = pOut;
  do {
    lVar7 = 0;
    while( true ) {
      piVar5 = (int *)((long)p1Beg + lVar7);
      if ((p1End <= piVar5) || (p2End <= p2Beg)) {
        piVar6 = (int *)((long)piVar6 + lVar7);
        lVar7 = (long)piVar6 - (long)pOut;
        for (; piVar5 < p1End; piVar5 = piVar5 + 2) {
          *piVar6 = *piVar5;
          piVar6[1] = piVar5[1];
          piVar6 = piVar6 + 2;
          lVar7 = lVar7 + 8;
        }
        for (lVar3 = 0; piVar5 = (int *)((long)p2Beg + lVar3), piVar5 < p2End; lVar3 = lVar3 + 8) {
          *(int *)((long)piVar6 + lVar3) = *piVar5;
          *(int *)((long)piVar6 + lVar3 + 4) = piVar5[1];
          lVar7 = lVar7 + 8;
        }
        if (lVar7 >> 2 == (long)((int)(uVar2 >> 2) + (int)(uVar4 >> 2))) {
          return;
        }
        __assert_fail("pOut - pOutBeg == nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                      ,0xa9,"void Abc_MergeSortCostMerge(int *, int *, int *, int *, int *)");
      }
      iVar1 = *(int *)((long)p1Beg + lVar7 + 4);
      if (iVar1 == p2Beg[1]) {
        piVar5 = (int *)((long)p1Beg + lVar7);
        p1Beg = piVar5 + 2;
        piVar6 = (int *)((long)piVar6 + lVar7 + 0x10);
        piVar6[-4] = *piVar5;
        piVar6[-3] = piVar5[1];
        piVar6[-2] = *p2Beg;
        piVar6[-1] = p2Beg[1];
        goto LAB_00388706;
      }
      if (p2Beg[1] <= iVar1) break;
      *(undefined4 *)((long)piVar6 + lVar7) = *(undefined4 *)((long)p1Beg + lVar7);
      *(undefined4 *)((long)piVar6 + lVar7 + 4) = *(undefined4 *)((long)p1Beg + lVar7 + 4);
      lVar7 = lVar7 + 8;
    }
    piVar5 = (int *)((long)piVar6 + lVar7);
    piVar6 = piVar5 + 2;
    *piVar5 = *p2Beg;
    piVar5[1] = p2Beg[1];
    p1Beg = (int *)((long)p1Beg + lVar7);
LAB_00388706:
    p2Beg = p2Beg + 2;
  } while( true );
}

Assistant:

void Abc_MergeSortCostMerge( int * p1Beg, int * p1End, int * p2Beg, int * p2End, int * pOut )
{
    int nEntries = (p1End - p1Beg) + (p2End - p2Beg);
    int * pOutBeg = pOut;
    while ( p1Beg < p1End && p2Beg < p2End )
    {
        if ( p1Beg[1] == p2Beg[1] )
            *pOut++ = *p1Beg++, *pOut++ = *p1Beg++, *pOut++ = *p2Beg++, *pOut++ = *p2Beg++; 
        else if ( p1Beg[1] < p2Beg[1] )
            *pOut++ = *p1Beg++, *pOut++ = *p1Beg++; 
        else // if ( p1Beg[1] > p2Beg[1] )
            *pOut++ = *p2Beg++, *pOut++ = *p2Beg++; 
    }
    while ( p1Beg < p1End )
        *pOut++ = *p1Beg++, *pOut++ = *p1Beg++; 
    while ( p2Beg < p2End )
        *pOut++ = *p2Beg++, *pOut++ = *p2Beg++;
    assert( pOut - pOutBeg == nEntries );
}